

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> *
__thiscall
soinn::ESOINN::getCenterOfCluster
          (vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,ESOINN *this,int classId)

{
  _List_node_base *v_00;
  bool bVar1;
  reference ppvVar2;
  vertex_bundled *pvVar3;
  vertex_descriptor v;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> bgl_range_490;
  Vertex center;
  double density;
  int classId_local;
  ESOINN *this_local;
  
  center = (Vertex)0xbff0000000000000;
  _v = boost::
       vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
                 ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                   *)&this->graph);
  while (bVar1 = std::operator!=((_Self *)&v,&bgl_range_490.first), bVar1) {
    while (bVar1 = std::operator!=((_Self *)&v,&bgl_range_490.first), bVar1) {
      ppvVar2 = std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)&v);
      v_00 = (_List_node_base *)*ppvVar2;
      pvVar3 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,v_00);
      if ((pvVar3->classId == classId) &&
         (pvVar3 = boost::
                   adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                   ::operator[](&this->graph,v_00), (double)center < pvVar3->density)) {
        bgl_range_490.second._M_node = v_00;
        pvVar3 = boost::
                 adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 ::operator[](&this->graph,v_00);
        center = (Vertex)pvVar3->density;
      }
      std::_List_iterator<void_*>::operator++((_List_iterator<void_*> *)&v);
    }
    v = bgl_range_490.first._M_node;
  }
  pvVar3 = boost::
           adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
           ::operator[](&this->graph,bgl_range_490.second._M_node);
  boost::numeric::ublas::
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::vector
            (__return_storage_ptr__,&pvVar3->weight);
  return __return_storage_ptr__;
}

Assistant:

boost::numeric::ublas::vector<double> ESOINN::getCenterOfCluster(int classId)
{
    double density = -1;
    Vertex center;
    BGL_FORALL_VERTICES(v, graph, Graph) {
        if(graph[v].classId == classId && graph[v].density > density) {
            center = v;
            density = graph[center].density;
        }
    }
    return graph[center].weight;
}